

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O2

void __thiscall
Assimp::FBX::FBXConverter::ProcessMorphAnimDatas
          (FBXConverter *this,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<long,_morphKeyData_*,_std::less<long>,_std::allocator<std::pair<const_long,_morphKeyData_*>_>_>_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<long,_morphKeyData_*,_std::less<long>,_std::allocator<std::pair<const_long,_morphKeyData_*>_>_>_*>_>_>
          *morphAnimDatas,BlendShapeChannel *bsc,AnimationCurveNode *node)

{
  KeyValueList *this_00;
  char *__s;
  long lVar1;
  long *plVar2;
  bool bVar3;
  uint uVar4;
  Object *pOVar5;
  long lVar6;
  __normal_iterator<const_Assimp::FBX::BlendShapeChannel_*const_*,_std::vector<const_Assimp::FBX::BlendShapeChannel_*,_std::allocator<const_Assimp::FBX::BlendShapeChannel_*>_>_>
  _Var7;
  pointer ppCVar8;
  __normal_iterator<const_Assimp::FBX::Geometry_*const_*,_std::vector<const_Assimp::FBX::Geometry_*,_std::allocator<const_Assimp::FBX::Geometry_*>_>_>
  _Var9;
  iterator iVar10;
  _Rb_tree<long,std::pair<long_const,morphKeyData*>,std::_Select1st<std::pair<long_const,morphKeyData*>>,std::less<long>,std::allocator<std::pair<long_const,morphKeyData*>>>
  *this_01;
  AnimationCurveMap *pAVar11;
  iterator iVar12;
  _Base_ptr p_Var13;
  const_reference pvVar14;
  size_type __n;
  FBXConverter *this_02;
  size_t __n_00;
  long *plVar15;
  uint channelIndex;
  FBXConverter *local_548;
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::map<long,morphKeyData*,std::less<long>,std::allocator<std::pair<long_const,morphKeyData*>>>*>,std::_Select1st<std::pair<std::__cxx11::string_const,std::map<long,morphKeyData*,std::less<long>,std::allocator<std::pair<long_const,morphKeyData*>>>*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::map<long,morphKeyData*,std::less<long>,std::allocator<std::pair<long_const,morphKeyData*>>>*>>>
  *local_540;
  long key;
  pointer local_530;
  pointer local_528;
  pointer local_520;
  pointer local_518;
  AnimationCurveNode *local_510;
  _Base_ptr local_508;
  pointer local_500;
  pointer local_4f8;
  _Base_ptr local_4f0;
  _Base_ptr local_4e8;
  _Base_ptr local_4e0;
  Geometry *geo;
  BlendShapeChannel *bsc_local;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::AnimationCurve_*>
  curvesIt;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a0;
  vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
  geoConnections;
  vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
  bsConnections;
  vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
  bscConnections;
  aiString name;
  
  local_548 = this;
  local_510 = node;
  bsc_local = bsc;
  Document::GetConnectionsBySourceSequenced
            (&bscConnections,this->doc,(bsc->super_Deformer).super_Object.id,"Deformer");
  local_530 = bscConnections.
              super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  local_508 = &(morphAnimDatas->_M_t)._M_impl.super__Rb_tree_header._M_header;
  local_540 = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::map<long,morphKeyData*,std::less<long>,std::allocator<std::pair<long_const,morphKeyData*>>>*>,std::_Select1st<std::pair<std::__cxx11::string_const,std::map<long,morphKeyData*,std::less<long>,std::allocator<std::pair<long_const,morphKeyData*>>>*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::map<long,morphKeyData*,std::less<long>,std::allocator<std::pair<long_const,morphKeyData*>>>*>>>
               *)morphAnimDatas;
  while (bscConnections.
         super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
         ._M_impl.super__Vector_impl_data._M_start != local_530) {
    local_528 = bscConnections.
                super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
    pOVar5 = Connection::DestinationObject
                       (*bscConnections.
                         super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
                         ._M_impl.super__Vector_impl_data._M_start);
    if (((pOVar5 != (Object *)0x0) &&
        (lVar6 = __dynamic_cast(pOVar5,&Object::typeinfo,&BlendShape::typeinfo,0), lVar6 != 0)) &&
       (_Var7 = std::
                __find_if<__gnu_cxx::__normal_iterator<Assimp::FBX::BlendShapeChannel_const*const*,std::vector<Assimp::FBX::BlendShapeChannel_const*,std::allocator<Assimp::FBX::BlendShapeChannel_const*>>>,__gnu_cxx::__ops::_Iter_equals_val<Assimp::FBX::BlendShapeChannel_const*const>>
                          (*(undefined8 *)(lVar6 + 0x48),*(undefined8 *)(lVar6 + 0x50),&bsc_local),
       _Var7._M_current != *(BlendShapeChannel ***)(lVar6 + 0x50))) {
      channelIndex = (uint)((ulong)((long)_Var7._M_current - *(long *)(lVar6 + 0x48)) >> 3);
      Document::GetConnectionsBySourceSequenced
                (&bsConnections,local_548->doc,*(uint64_t *)(lVar6 + 0x30),"Geometry");
      local_520 = bsConnections.
                  super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      ppCVar8 = bsConnections.
                super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      while (ppCVar8 != local_520) {
        local_518 = ppCVar8;
        pOVar5 = Connection::DestinationObject(*ppCVar8);
        if ((pOVar5 != (Object *)0x0) &&
           (geo = (Geometry *)__dynamic_cast(pOVar5,&Object::typeinfo,&Geometry::typeinfo,0),
           geo != (Geometry *)0x0)) {
          Document::GetConnectionsBySourceSequenced
                    (&geoConnections,local_548->doc,(geo->super_Object).id,"Model");
          local_4f8 = geoConnections.
                      super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          for (ppCVar8 = geoConnections.
                         super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
                         ._M_impl.super__Vector_impl_data._M_start; ppCVar8 != local_4f8;
              ppCVar8 = ppCVar8 + 1) {
            pOVar5 = Connection::DestinationObject(*ppCVar8);
            if ((pOVar5 != (Object *)0x0) &&
               (lVar6 = __dynamic_cast(pOVar5,&Object::typeinfo,&Model::typeinfo,0), lVar6 != 0)) {
              local_500 = ppCVar8;
              _Var9 = std::
                      __find_if<__gnu_cxx::__normal_iterator<Assimp::FBX::Geometry_const*const*,std::vector<Assimp::FBX::Geometry_const*,std::allocator<Assimp::FBX::Geometry_const*>>>,__gnu_cxx::__ops::_Iter_equals_val<Assimp::FBX::Geometry_const*const>>
                                (*(undefined8 *)(lVar6 + 0x50),*(undefined8 *)(lVar6 + 0x58),&geo);
              lVar1 = *(long *)(lVar6 + 0x50);
              this_02 = (FBXConverter *)(lVar6 + 0x10);
              std::operator+(&local_4a0,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             this_02,"*");
              FixNodeName(&curvesIt.first,this_02,&local_4a0);
              __n_00 = curvesIt.first._M_string_length & 0xffffffff;
              if ((curvesIt.first._M_string_length & 0xfffffc00) != 0) {
                __n_00 = 0x3ff;
              }
              name.length = (ai_uint32)__n_00;
              __s = name.data;
              memcpy(__s,curvesIt.first._M_dataplus._M_p,__n_00);
              name.data[__n_00] = '\0';
              std::__cxx11::string::~string((string *)&curvesIt);
              std::__cxx11::string::~string((string *)&local_4a0);
              uVar4 = ASSIMP_itoa10(__s + name.length,0x3ff,
                                    (int32_t)((ulong)((long)_Var9._M_current - lVar1) >> 3));
              name.length = uVar4 + 1;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&curvesIt,__s,(allocator<char> *)&local_4a0);
              iVar10 = std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<long,_morphKeyData_*,_std::less<long>,_std::allocator<std::pair<const_long,_morphKeyData_*>_>_>_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<long,_morphKeyData_*,_std::less<long>,_std::allocator<std::pair<const_long,_morphKeyData_*>_>_>_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<long,_morphKeyData_*,_std::less<long>,_std::allocator<std::pair<const_long,_morphKeyData_*>_>_>_*>_>_>
                       ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<long,_morphKeyData_*,_std::less<long>,_std::allocator<std::pair<const_long,_morphKeyData_*>_>_>_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<long,_morphKeyData_*,_std::less<long>,_std::allocator<std::pair<const_long,_morphKeyData_*>_>_>_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<long,_morphKeyData_*,_std::less<long>,_std::allocator<std::pair<const_long,_morphKeyData_*>_>_>_*>_>_>
                               *)local_540,&curvesIt.first);
              std::__cxx11::string::~string((string *)&curvesIt);
              if (iVar10._M_node == local_508) {
                this_01 = (_Rb_tree<long,std::pair<long_const,morphKeyData*>,std::_Select1st<std::pair<long_const,morphKeyData*>>,std::less<long>,std::allocator<std::pair<long_const,morphKeyData*>>>
                           *)operator_new(0x30);
                *(undefined8 *)(this_01 + 0x10) = 0;
                *(undefined8 *)(this_01 + 0x18) = 0;
                *(undefined8 *)this_01 = 0;
                *(undefined8 *)(this_01 + 8) = 0;
                *(_Rb_tree<long,std::pair<long_const,morphKeyData*>,std::_Select1st<std::pair<long_const,morphKeyData*>>,std::less<long>,std::allocator<std::pair<long_const,morphKeyData*>>>
                  **)(this_01 + 0x18) = this_01 + 8;
                *(_Rb_tree<long,std::pair<long_const,morphKeyData*>,std::_Select1st<std::pair<long_const,morphKeyData*>>,std::less<long>,std::allocator<std::pair<long_const,morphKeyData*>>>
                  **)(this_01 + 0x20) = this_01 + 8;
                *(undefined8 *)(this_01 + 0x28) = 0;
                curvesIt.first._M_dataplus._M_p = name.data;
                curvesIt.first._M_string_length = (size_type)this_01;
                std::
                _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::map<long,morphKeyData*,std::less<long>,std::allocator<std::pair<long_const,morphKeyData*>>>*>,std::_Select1st<std::pair<std::__cxx11::string_const,std::map<long,morphKeyData*,std::less<long>,std::allocator<std::pair<long_const,morphKeyData*>>>*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::map<long,morphKeyData*,std::less<long>,std::allocator<std::pair<long_const,morphKeyData*>>>*>>>
                ::
                _M_emplace_unique<std::pair<char_const*,std::map<long,morphKeyData*,std::less<long>,std::allocator<std::pair<long_const,morphKeyData*>>>*>>
                          (local_540,
                           (pair<const_char_*,_std::map<long,_morphKeyData_*,_std::less<long>,_std::allocator<std::pair<const_long,_morphKeyData_*>_>_>_*>
                            *)&curvesIt);
              }
              else {
                this_01 = *(_Rb_tree<long,std::pair<long_const,morphKeyData*>,std::_Select1st<std::pair<long_const,morphKeyData*>>,std::less<long>,std::allocator<std::pair<long_const,morphKeyData*>>>
                            **)(iVar10._M_node + 2);
              }
              pAVar11 = AnimationCurveNode::Curves_abi_cxx11_(local_510);
              local_4f0 = &(pAVar11->_M_t)._M_impl.super__Rb_tree_header._M_header;
              local_4e0 = (_Base_ptr)(this_01 + 8);
              p_Var13 = (pAVar11->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
              while (ppCVar8 = local_500, p_Var13 != local_4f0) {
                std::
                pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::AnimationCurve_*>
                ::
                pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::AnimationCurve_*,_true>
                          (&curvesIt,
                           (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::AnimationCurve_*>
                            *)(p_Var13 + 1));
                local_4e8 = p_Var13;
                bVar3 = std::operator==(&curvesIt.first,"d|DeformPercent");
                if (bVar3) {
                  this_00 = &(curvesIt.second)->values;
                  plVar2 = ((curvesIt.second)->keys).super__Vector_base<long,_std::allocator<long>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                  __n = 0;
                  for (plVar15 = ((curvesIt.second)->keys).
                                 super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                 super__Vector_impl_data._M_start; plVar15 != plVar2;
                      plVar15 = plVar15 + 1) {
                    key = *plVar15;
                    iVar12 = std::
                             _Rb_tree<long,_std::pair<const_long,_morphKeyData_*>,_std::_Select1st<std::pair<const_long,_morphKeyData_*>_>,_std::less<long>,_std::allocator<std::pair<const_long,_morphKeyData_*>_>_>
                             ::find((_Rb_tree<long,_std::pair<const_long,_morphKeyData_*>,_std::_Select1st<std::pair<const_long,_morphKeyData_*>_>,_std::less<long>,_std::allocator<std::pair<const_long,_morphKeyData_*>_>_>
                                     *)this_01,&key);
                    if (iVar12._M_node == local_4e0) {
                      p_Var13 = (_Base_ptr)operator_new(0x30);
                      *(undefined8 *)(p_Var13 + 1) = 0;
                      p_Var13[1]._M_parent = (_Base_ptr)0x0;
                      p_Var13->_M_left = (_Base_ptr)0x0;
                      p_Var13->_M_right = (_Base_ptr)0x0;
                      *(undefined8 *)&p_Var13->_M_color = 0;
                      p_Var13->_M_parent = (_Base_ptr)0x0;
                      local_4a0._M_dataplus._M_p = (pointer)key;
                      local_4a0._M_string_length = (size_type)p_Var13;
                      std::
                      _Rb_tree<long,std::pair<long_const,morphKeyData*>,std::_Select1st<std::pair<long_const,morphKeyData*>>,std::less<long>,std::allocator<std::pair<long_const,morphKeyData*>>>
                      ::_M_emplace_unique<std::pair<long,morphKeyData*>>
                                (this_01,(pair<long,_morphKeyData_*> *)&local_4a0);
                    }
                    else {
                      p_Var13 = iVar12._M_node[1]._M_parent;
                    }
                    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)p_Var13,
                               &channelIndex);
                    pvVar14 = std::vector<float,_std::allocator<float>_>::at(this_00,__n);
                    local_4a0._M_dataplus._M_p._0_4_ = *pvVar14 / 100.0;
                    std::vector<float,_std::allocator<float>_>::emplace_back<float>
                              ((vector<float,_std::allocator<float>_> *)&p_Var13->_M_right,
                               (float *)&local_4a0);
                    __n = (size_type)((int)__n + 1);
                  }
                }
                std::__cxx11::string::~string((string *)&curvesIt);
                p_Var13 = (_Base_ptr)std::_Rb_tree_increment(local_4e8);
              }
            }
          }
          std::
          _Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
          ::~_Vector_base(&geoConnections.
                           super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
                         );
        }
        ppCVar8 = local_518 + 1;
      }
      std::
      _Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
      ::~_Vector_base(&bsConnections.
                       super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
                     );
    }
    bscConnections.
    super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
    ._M_impl.super__Vector_impl_data._M_start = local_528 + 1;
  }
  std::
  _Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>::
  ~_Vector_base(&bscConnections.
                 super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
               );
  return;
}

Assistant:

void FBXConverter::ProcessMorphAnimDatas(std::map<std::string, morphAnimData*>* morphAnimDatas, const BlendShapeChannel* bsc, const AnimationCurveNode* node) {
            std::vector<const Connection*> bscConnections = doc.GetConnectionsBySourceSequenced(bsc->ID(), "Deformer");
            for (const Connection* bscConnection : bscConnections) {
                auto bs = dynamic_cast<const BlendShape*>(bscConnection->DestinationObject());
                if (bs) {
                    auto channelIt = std::find(bs->BlendShapeChannels().begin(), bs->BlendShapeChannels().end(), bsc);
                    if (channelIt != bs->BlendShapeChannels().end()) {
                        auto channelIndex = static_cast<unsigned int>(std::distance(bs->BlendShapeChannels().begin(), channelIt));
                        std::vector<const Connection*> bsConnections = doc.GetConnectionsBySourceSequenced(bs->ID(), "Geometry");
                        for (const Connection* bsConnection : bsConnections) {
                            auto geo = dynamic_cast<const Geometry*>(bsConnection->DestinationObject());
                            if (geo) {
                                std::vector<const Connection*> geoConnections = doc.GetConnectionsBySourceSequenced(geo->ID(), "Model");
                                for (const Connection* geoConnection : geoConnections) {
                                    auto model = dynamic_cast<const Model*>(geoConnection->DestinationObject());
                                    if (model) {
                                        auto geoIt = std::find(model->GetGeometry().begin(), model->GetGeometry().end(), geo);
                                        auto geoIndex = static_cast<unsigned int>(std::distance(model->GetGeometry().begin(), geoIt));
                                        auto name = aiString(FixNodeName(model->Name() + "*"));
                                        name.length = 1 + ASSIMP_itoa10(name.data + name.length, MAXLEN - 1, geoIndex);
                                        morphAnimData* animData;
                                        auto animIt = morphAnimDatas->find(name.C_Str());
                                        if (animIt == morphAnimDatas->end()) {
                                            animData = new morphAnimData();
                                            morphAnimDatas->insert(std::make_pair(name.C_Str(), animData));
                                        }
                                        else {
                                            animData = animIt->second;
                                        }
                                        for (std::pair<std::string, const AnimationCurve*> curvesIt : node->Curves()) {
                                            if (curvesIt.first == "d|DeformPercent") {
                                                const AnimationCurve* animationCurve = curvesIt.second;
                                                const KeyTimeList& keys = animationCurve->GetKeys();
                                                const KeyValueList& values = animationCurve->GetValues();
                                                unsigned int k = 0;
                                                for (auto key : keys) {
                                                    morphKeyData* keyData;
                                                    auto keyIt = animData->find(key);
                                                    if (keyIt == animData->end()) {
                                                        keyData = new morphKeyData();
                                                        animData->insert(std::make_pair(key, keyData));
                                                    }
                                                    else {
                                                        keyData = keyIt->second;
                                                    }
                                                    keyData->values.push_back(channelIndex);
                                                    keyData->weights.push_back(values.at(k) / 100.0f);
                                                    k++;
                                                }
                                            }
                                        }
                                    }
                                }
                            }
                        }
                    }
                }
            }
        }